

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx512.cpp
# Opt level: O0

void __thiscall
ncnn::DeformableConv2D_x86_avx512::destroy_pipeline(DeformableConv2D_x86_avx512 *this)

{
  Option *in_stack_00000018;
  DeformableConv2D_x86_avx512 *in_stack_00000020;
  
  destroy_pipeline(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

int DeformableConv2D_x86_avx512::destroy_pipeline(const Option& opt)
{
    if (inner_product)
    {
        inner_product->destroy_pipeline(opt);
        delete inner_product;
        inner_product = 0;
    }
    if (permute)
    {
        permute->destroy_pipeline(opt);
        delete permute;
        permute = 0;
    }

    return 0;
}